

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.cpp
# Opt level: O0

void __thiscall xercesc_4_0::XMLDateTime::getYearMonth(XMLDateTime *this)

{
  int iVar1;
  int iVar2;
  SchemaDateTimeException *pSVar3;
  XMLSize_t local_48;
  int yearSeparator;
  XMLSize_t start;
  XMLDateTime *this_local;
  
  if (this->fEnd < this->fStart + 7) {
    pSVar3 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
    SchemaDateTimeException::SchemaDateTimeException
              (pSVar3,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
               ,0x4a8,DateTime_ym_incomplete,this->fBuffer,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
               this->fMemoryManager);
    __cxa_throw(pSVar3,&SchemaDateTimeException::typeinfo,
                SchemaDateTimeException::~SchemaDateTimeException);
  }
  if (*this->fBuffer == L'-') {
    local_48 = this->fStart + 1;
  }
  else {
    local_48 = this->fStart;
  }
  iVar1 = indexOf(this,local_48,this->fEnd,L'-');
  if (iVar1 == -1) {
    pSVar3 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
    SchemaDateTimeException::SchemaDateTimeException
              (pSVar3,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
               ,0x4b6,DateTime_ym_invalid,this->fBuffer,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
               this->fMemoryManager);
    __cxa_throw(pSVar3,&SchemaDateTimeException::typeinfo,
                SchemaDateTimeException::~SchemaDateTimeException);
  }
  iVar2 = parseIntYear(this,(long)iVar1);
  this->fValue[0] = iVar2;
  this->fStart = (long)(iVar1 + 1);
  if (this->fEnd < this->fStart + 2) {
    pSVar3 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
    SchemaDateTimeException::SchemaDateTimeException
              (pSVar3,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
               ,0x4c3,DateTime_ym_noMonth,this->fBuffer,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
               this->fMemoryManager);
    __cxa_throw(pSVar3,&SchemaDateTimeException::typeinfo,
                SchemaDateTimeException::~SchemaDateTimeException);
  }
  iVar1 = parseInt(this,this->fStart,(long)(iVar1 + 3));
  this->fValue[1] = iVar1;
  this->fStart = this->fStart + 2;
  return;
}

Assistant:

void XMLDateTime::getYearMonth()
{

    // Ensure enough chars in buffer
    if ( (fStart+YMONTH_MIN_SIZE) > fEnd)
        ThrowXMLwithMemMgr1(SchemaDateTimeException
                , XMLExcepts::DateTime_ym_incomplete
                , fBuffer
                , fMemoryManager);
        //"Imcomplete YearMonth Format";

    // skip the first leading '-'
    XMLSize_t start = ( fBuffer[0] == chDash ) ? fStart + 1 : fStart;

    //
    // search for year separator '-'
    //
    int yearSeparator = indexOf(start, fEnd, DATE_SEPARATOR);
    if ( yearSeparator == NOT_FOUND)
        ThrowXMLwithMemMgr1(SchemaDateTimeException
                , XMLExcepts::DateTime_ym_invalid
                , fBuffer
                , fMemoryManager);
        //("Year separator is missing or misplaced");

    fValue[CentYear] = parseIntYear(yearSeparator);
    fStart = yearSeparator + 1;  //skip the '-' and point to the first M

    //
    //gonna check we have enough byte for month
    //
    if ((fStart + 2) > fEnd )
        ThrowXMLwithMemMgr1(SchemaDateTimeException
                , XMLExcepts::DateTime_ym_noMonth
                , fBuffer
                , fMemoryManager);
        //"no month in buffer"

    fValue[Month] = parseInt(fStart, yearSeparator + 3);
    fStart += 2;  //fStart points right after the MONTH

    return;
}